

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitBuffer.cpp
# Opt level: O1

TEmitBufferAllocation * __thiscall
EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
::AllocateBuffer(EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
                 *this,size_t bytes,BYTE **ppBuffer,ushort pdataCount,ushort xdataSize,
                bool canAllocInPreReservedHeapPageSegment,bool isAnyJittedCode)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  TEmitBufferAllocation *allocation;
  SIZE_T SVar4;
  undefined1 local_80 [8];
  MEMORY_BASIC_INFORMATION memBasicInfo;
  
  CCLock::Enter(&(this->criticalSection).super_CCLock);
  memBasicInfo._40_8_ = ppBuffer;
  if (ppBuffer == (BYTE **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                       ,0x161,"(ppBuffer != nullptr)","ppBuffer != nullptr");
    if (!bVar2) goto LAB_0040a697;
    *puVar3 = 0;
  }
  allocation = NewAllocation(this,bytes,pdataCount,xdataSize,canAllocInPreReservedHeapPageSegment,
                             isAnyJittedCode);
  GetBuffer(this,allocation,bytes,(BYTE **)memBasicInfo._40_8_);
  SVar4 = VirtualQueryEx(this->processHandle,allocation->allocation->address,
                         (PMEMORY_BASIC_INFORMATION)local_80,0x30);
  if ((SVar4 != 0) && (memBasicInfo.RegionSize._4_4_ != 0x20)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                       ,0x16a,"(resultBytes == 0 || memBasicInfo.Protect == 0x20)",
                       "resultBytes == 0 || memBasicInfo.Protect == PAGE_EXECUTE_READ");
    if (!bVar2) {
LAB_0040a697:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  CCLock::Leave(&(this->criticalSection).super_CCLock);
  return allocation;
}

Assistant:

EmitBufferAllocation<TAlloc, TPreReservedAlloc>*
EmitBufferManager<TAlloc, TPreReservedAlloc, SyncObject>::AllocateBuffer(__in size_t bytes, __deref_bcount(bytes) BYTE** ppBuffer, ushort pdataCount /*=0*/, ushort xdataSize  /*=0*/, bool canAllocInPreReservedHeapPageSegment /*=false*/,
    bool isAnyJittedCode /* = false*/)
{
    AutoRealOrFakeCriticalSection<SyncObject> autoCs(&this->criticalSection);

    Assert(ppBuffer != nullptr);

    TEmitBufferAllocation * allocation = this->NewAllocation(bytes, pdataCount, xdataSize, canAllocInPreReservedHeapPageSegment, isAnyJittedCode);

    GetBuffer(allocation, bytes, ppBuffer);

#if DBG
    MEMORY_BASIC_INFORMATION memBasicInfo;
    size_t resultBytes = VirtualQueryEx(this->processHandle, allocation->allocation->address, &memBasicInfo, sizeof(memBasicInfo));
    Assert(resultBytes == 0 || memBasicInfo.Protect == PAGE_EXECUTE_READ);
#endif

    return allocation;
}